

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLinActuator.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkLinActuator::ChLinkLinActuator(ChLinkLinActuator *this,ChLinkLinActuator *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  ChLinkLockLock::ChLinkLockLock(&this->super_ChLinkLockLock,&other->super_ChLinkLockLock);
  (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.super_ChLinkBase.
  super_ChPhysicsItem.super_ChObj._vptr_ChObj = &PTR__ChLinkLinActuator_00b1a1b0;
  (this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->offset = other->offset;
  iVar2 = (*((other->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_20,(ChFunction *)CONCAT44(extraout_var,iVar2));
  _Var1._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var,iVar2);
  (this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
  }
  return;
}

Assistant:

ChLinkLinActuator::ChLinkLinActuator(const ChLinkLinActuator& other) : ChLinkLockLock(other) {
    offset = other.offset;
    dist_funct = std::shared_ptr<ChFunction>(other.dist_funct->Clone());
}